

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

Builder * embree::avx::BVH8BuilderTwoLevelTriangle4MeshSAH
                    (void *bvh,Scene *scene,bool useMortonBuilder)

{
  long lVar1;
  Builder *pBVar2;
  _func_int **pp_Var3;
  
  pBVar2 = (Builder *)operator_new(0xa8);
  (pBVar2->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar2->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVHNBuilderTwoLevel_022188e8;
  pBVar2[1].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[2].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)bvh;
  pBVar2[3].super_RefCount._vptr_RefCount = (_func_int **)scene;
  lVar1 = *(long *)&(scene->super_AccelN).field_0x188;
  pp_Var3 = (_func_int **)(lVar1 + 0x550);
  if (lVar1 == 0) {
    pp_Var3 = (_func_int **)0x0;
  }
  pBVar2[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pp_Var3;
  *(undefined1 *)&pBVar2[4].super_RefCount._vptr_RefCount = 0;
  pBVar2[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[5].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[6].super_RefCount._vptr_RefCount = pp_Var3;
  *(undefined1 *)&pBVar2[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[8].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[7].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[7].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[9].super_RefCount._vptr_RefCount = (_func_int **)0x400;
  pBVar2[9].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0x100000;
  *(bool *)&pBVar2[10].super_RefCount._vptr_RefCount = useMortonBuilder;
  return pBVar2;
}

Assistant:

Builder* BVH8BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }